

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_blind_generator_blind_sum
              (secp256k1_context *ctx,uint64_t *value,uchar **generator_blind,
              uchar **blinding_factor,size_t n_total,size_t n_inputs)

{
  undefined1 local_b0 [8];
  secp256k1_scalar addend;
  ulong uStack_88;
  int overflow;
  size_t i;
  secp256k1_scalar tmp;
  secp256k1_scalar sum;
  size_t n_inputs_local;
  size_t n_total_local;
  uchar **blinding_factor_local;
  uchar **generator_blind_local;
  uint64_t *value_local;
  secp256k1_context *ctx_local;
  
  if (n_total == 0 || value != (uint64_t *)0x0) {
    if (n_total == 0 || generator_blind != (uchar **)0x0) {
      if (n_total == 0 || blinding_factor != (uchar **)0x0) {
        if (n_inputs < n_total) {
          if (n_total == 0) {
            ctx_local._4_4_ = 1;
          }
          else {
            secp256k1_scalar_set_int((secp256k1_scalar *)(tmp.d + 3),0);
            for (uStack_88 = 0; uStack_88 < n_total; uStack_88 = uStack_88 + 1) {
              addend.d[3]._4_4_ = 0;
              secp256k1_scalar_set_u64((secp256k1_scalar *)local_b0,value[uStack_88]);
              secp256k1_scalar_set_b32
                        ((secp256k1_scalar *)&i,generator_blind[uStack_88],
                         (int *)((long)addend.d + 0x1c));
              if (addend.d[3]._4_4_ == 1) {
                secp256k1_scalar_clear((secp256k1_scalar *)&i);
                secp256k1_scalar_clear((secp256k1_scalar *)local_b0);
                secp256k1_scalar_clear((secp256k1_scalar *)(tmp.d + 3));
                return 0;
              }
              secp256k1_scalar_mul
                        ((secp256k1_scalar *)local_b0,(secp256k1_scalar *)local_b0,
                         (secp256k1_scalar *)&i);
              secp256k1_scalar_set_b32
                        ((secp256k1_scalar *)&i,blinding_factor[uStack_88],
                         (int *)((long)addend.d + 0x1c));
              if (addend.d[3]._4_4_ == 1) {
                secp256k1_scalar_clear((secp256k1_scalar *)&i);
                secp256k1_scalar_clear((secp256k1_scalar *)local_b0);
                secp256k1_scalar_clear((secp256k1_scalar *)(tmp.d + 3));
                return 0;
              }
              secp256k1_scalar_add
                        ((secp256k1_scalar *)local_b0,(secp256k1_scalar *)local_b0,
                         (secp256k1_scalar *)&i);
              secp256k1_scalar_cond_negate
                        ((secp256k1_scalar *)local_b0,(uint)(uStack_88 < n_inputs));
              secp256k1_scalar_add
                        ((secp256k1_scalar *)(tmp.d + 3),(secp256k1_scalar *)(tmp.d + 3),
                         (secp256k1_scalar *)local_b0);
              secp256k1_scalar_clear((secp256k1_scalar *)local_b0);
            }
            secp256k1_scalar_negate((secp256k1_scalar *)(tmp.d + 3),(secp256k1_scalar *)(tmp.d + 3))
            ;
            secp256k1_scalar_add
                      ((secp256k1_scalar *)&i,(secp256k1_scalar *)&i,(secp256k1_scalar *)(tmp.d + 3)
                      );
            secp256k1_scalar_get_b32(blinding_factor[n_total - 1],(secp256k1_scalar *)&i);
            secp256k1_scalar_clear((secp256k1_scalar *)&i);
            secp256k1_scalar_clear((secp256k1_scalar *)(tmp.d + 3));
            ctx_local._4_4_ = 1;
          }
        }
        else {
          secp256k1_callback_call(&ctx->illegal_callback,"n_total > n_inputs");
          ctx_local._4_4_ = 0;
        }
      }
      else {
        secp256k1_callback_call(&ctx->illegal_callback,"n_total == 0 || blinding_factor != NULL");
        ctx_local._4_4_ = 0;
      }
    }
    else {
      secp256k1_callback_call(&ctx->illegal_callback,"n_total == 0 || generator_blind != NULL");
      ctx_local._4_4_ = 0;
    }
  }
  else {
    secp256k1_callback_call(&ctx->illegal_callback,"n_total == 0 || value != NULL");
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_pedersen_blind_generator_blind_sum(const secp256k1_context* ctx, const uint64_t *value, const unsigned char* const* generator_blind, unsigned char* const* blinding_factor, size_t n_total, size_t n_inputs) {
    secp256k1_scalar sum;
    secp256k1_scalar tmp;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(n_total == 0 || value != NULL);
    ARG_CHECK(n_total == 0 || generator_blind != NULL);
    ARG_CHECK(n_total == 0 || blinding_factor != NULL);
    ARG_CHECK(n_total > n_inputs);
    (void) ctx;

    if (n_total == 0) {
        return 1;
    }

    secp256k1_scalar_set_int(&sum, 0);
    for (i = 0; i < n_total; i++) {
        int overflow = 0;
        secp256k1_scalar addend;
        secp256k1_scalar_set_u64(&addend, value[i]);  /* s = v */

        secp256k1_scalar_set_b32(&tmp, generator_blind[i], &overflow);
        if (overflow == 1) {
            secp256k1_scalar_clear(&tmp);
            secp256k1_scalar_clear(&addend);
            secp256k1_scalar_clear(&sum);
            return 0;
        }
        secp256k1_scalar_mul(&addend, &addend, &tmp); /* s = vr */

        secp256k1_scalar_set_b32(&tmp, blinding_factor[i], &overflow);
        if (overflow == 1) {
            secp256k1_scalar_clear(&tmp);
            secp256k1_scalar_clear(&addend);
            secp256k1_scalar_clear(&sum);
            return 0;
        }
        secp256k1_scalar_add(&addend, &addend, &tmp); /* s = vr + r' */
        secp256k1_scalar_cond_negate(&addend, i < n_inputs);  /* s is negated if it's an input */
        secp256k1_scalar_add(&sum, &sum, &addend);    /* sum += s */
        secp256k1_scalar_clear(&addend);
    }

    /* Right now tmp has the last pedersen blinding factor. Subtract the sum from it. */
    secp256k1_scalar_negate(&sum, &sum);
    secp256k1_scalar_add(&tmp, &tmp, &sum);
    secp256k1_scalar_get_b32(blinding_factor[n_total - 1], &tmp);

    secp256k1_scalar_clear(&tmp);
    secp256k1_scalar_clear(&sum);
    return 1;
}